

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O0

bool cdftocsv::getrec(char *rec_,FILE *stream,int recsize_)

{
  int iVar1;
  int local_28;
  int ch;
  int totalread;
  int recsize__local;
  FILE *stream_local;
  char *rec__local;
  
  local_28 = 0;
  stream_local = (FILE *)rec_;
  while( true ) {
    if (local_28 == recsize_) {
      return true;
    }
    iVar1 = getc((FILE *)stream);
    if (iVar1 == -1) break;
    *stream_local = SUB41(iVar1,0);
    local_28 = local_28 + 1;
    stream_local = stream_local + 1;
  }
  return false;
}

Assistant:

bool getrec(char *rec_, FILE *stream, int recsize_)
	{
		int totalread = 0;
		while (totalread != recsize_) {
			int ch = getc(stream);
			if (ch == EOF) {
				return false;
			}
			*rec_ = ch;
			totalread++;
			rec_++;
		}

		return true;

	}